

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

bool __thiscall
tf::Executor::_invoke_module_task_impl(Executor *this,Worker *w,Node *node,Graph *graph)

{
  uint uVar1;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  beg;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  end;
  
  beg._M_current =
       (graph->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  end._M_current =
       (graph->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (beg._M_current != end._M_current) {
    uVar1 = node->_nstate;
    if ((uVar1 >> 0x1d & 1) == 0) {
      node->_nstate = uVar1 | 0x20000000;
      _schedule_graph_with_parent<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                (this,w,beg,end,node);
      return true;
    }
    node->_nstate = uVar1 & 0xdfffffff;
  }
  return false;
}

Assistant:

inline bool Executor::_invoke_module_task_impl(Worker& w, Node* node, Graph& graph) {

  // No need to do anything for empty graph
  if(graph.empty()) {
    return false;
  }

  // first entry - not spawned yet
  if((node->_nstate & NSTATE::PREEMPTED) == 0) {
    // signal the executor to preempt this node
    node->_nstate |= NSTATE::PREEMPTED;
    _schedule_graph_with_parent(w, graph.begin(), graph.end(), node);
    return true;
  }

  // second entry - already spawned
  node->_nstate &= ~NSTATE::PREEMPTED;

  return false;
}